

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O1

int str_rep(lua_State *L)

{
  char *s;
  lua_Integer lVar1;
  int iVar2;
  size_t l;
  luaL_Buffer b;
  size_t local_2038;
  luaL_Buffer local_2030;
  
  s = luaL_checklstring(L,1,&local_2038);
  lVar1 = luaL_checkinteger(L,2);
  luaL_buffinit(L,&local_2030);
  if (0 < (int)lVar1) {
    iVar2 = (int)lVar1 + 1;
    do {
      luaL_addlstring(&local_2030,s,local_2038);
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  luaL_pushresult(&local_2030);
  return 1;
}

Assistant:

static int str_rep (lua_State *L) {
  size_t l;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  int n = luaL_checkint(L, 2);
  luaL_buffinit(L, &b);
  while (n-- > 0)
    luaL_addlstring(&b, s, l);
  luaL_pushresult(&b);
  return 1;
}